

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_ptr_array.c
# Opt level: O1

void * zt_ptr_array_get_idx(zt_ptr_array *array,int32_t idx)

{
  void **ppvVar1;
  
  if (idx == -1) {
    ppvVar1 = array->array + (long)array->count + -1;
  }
  else {
    if (array->count <= idx) {
      return (void *)0x0;
    }
    ppvVar1 = array->array + idx;
  }
  return *ppvVar1;
}

Assistant:

void *
zt_ptr_array_get_idx(zt_ptr_array * array, int32_t idx) {
    if (idx == -1) {
        /* return the last element */
        return array->array[array->count - 1];
    }

    if (idx >= array->count) {
        return NULL;
    }

    return array->array[idx];
}